

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O1

size_t tinyusdz::Usd_IntegerCompression::DecompressFromBuffer
                 (char *compressed,size_t compressedSize,uint32_t *ints,size_t numInts,string *err,
                 char *workingSpace)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  uint32_t uVar5;
  ulong maxOutputSize;
  int *piVar6;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  int *local_40;
  
  if (numInts == 0) {
    maxOutputSize = 0;
  }
  else {
    maxOutputSize = (numInts * 2 + 7 >> 3) + numInts * 4 + 4;
  }
  if (workingSpace == (char *)0x0) {
    workingSpace = (char *)operator_new__(maxOutputSize);
    local_40 = (int *)workingSpace;
  }
  else {
    local_40 = (int *)0x0;
  }
  sVar3 = LZ4Compression::DecompressFromBuffer
                    (compressed,workingSpace,compressedSize,maxOutputSize,err);
  if (sVar3 == 0) {
    if (local_40 != (int *)0x0) {
      operator_delete__(local_40);
    }
    return 0;
  }
  iVar2 = *(int *)workingSpace;
  pbVar7 = (byte *)((long)workingSpace + 4);
  piVar6 = (int *)((long)workingSpace + (numInts * 2 + 7 >> 3) + 4);
  if (3 < numInts) {
    uVar5 = 0;
    sVar3 = numInts;
    do {
      bVar1 = *pbVar7;
      iVar4 = 0;
      do {
        uVar8 = (3 << ((byte)iVar4 & 0x1f) & (uint)bVar1) >> ((byte)iVar4 & 0x1f);
        if (uVar8 == 3) {
          iVar9 = *piVar6;
          piVar6 = piVar6 + 1;
        }
        else if (uVar8 == 2) {
          iVar9 = *piVar6;
          piVar6 = (int *)((long)piVar6 + 2);
          iVar9 = (int)(short)iVar9;
        }
        else {
          iVar9 = iVar2;
          if (uVar8 == 1) {
            iVar9 = *piVar6;
            piVar6 = (int *)((long)piVar6 + 1);
            iVar9 = (int)(char)iVar9;
          }
        }
        uVar5 = uVar5 + iVar9;
        *ints = uVar5;
        ints = ints + 1;
        iVar4 = iVar4 + 2;
      } while (iVar4 != 8);
      pbVar7 = pbVar7 + 1;
      sVar3 = sVar3 - 4;
    } while (3 < sVar3);
    pbVar7 = (byte *)((long)workingSpace + (numInts - 4 >> 2) + 5);
    numInts = sVar3;
  }
  sVar3 = (*(code *)(&DAT_00404bb8 + *(int *)(&DAT_00404bb8 + numInts * 4)))(pbVar7);
  return sVar3;
}

Assistant:

size_t
Usd_IntegerCompression::DecompressFromBuffer(
    char const *compressed, size_t compressedSize,
    uint32_t *ints, size_t numInts, std::string *err, char *workingSpace)
{
    return _DecompressIntegers(compressed, compressedSize,
                               ints, numInts, err, workingSpace);
}